

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fortran.c
# Opt level: O3

REF_STATUS
ref_fortran_import_face_(REF_INT *face_index,REF_INT *node_per_face,REF_INT *nface,REF_INT *f2n)

{
  int iVar1;
  int iVar2;
  int iVar3;
  REF_NODE pRVar4;
  REF_GRID_conflict pRVar5;
  uint uVar6;
  int iVar7;
  REF_INT *nodes;
  long lVar8;
  undefined8 uVar9;
  int iVar10;
  long lVar11;
  char *pcVar12;
  bool bVar13;
  REF_CELL ref_cell;
  REF_INT new_face;
  REF_CELL local_40;
  REF_INT local_34;
  
  pRVar4 = ref_grid->node;
  uVar6 = ref_grid_face_with(ref_grid,*node_per_face,&local_40);
  if (uVar6 == 0) {
    if (*node_per_face < -1) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fortran.c",
             0x65,"ref_fortran_import_face_","malloc nodes of REF_INT negative");
      uVar6 = 1;
    }
    else {
      nodes = (REF_INT *)malloc((ulong)(*node_per_face + 1) << 2);
      if (nodes == (REF_INT *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fortran.c",
               0x65,"ref_fortran_import_face_","malloc nodes of REF_INT NULL");
        uVar6 = 2;
      }
      else {
        iVar7 = *nface;
        if (0 < iVar7) {
          iVar10 = 0;
          do {
            pRVar5 = ref_grid;
            iVar1 = *node_per_face;
            lVar8 = (long)iVar1;
            if (lVar8 < 1) {
              nodes[lVar8] = *face_index;
            }
            else {
              lVar11 = 0;
              bVar13 = false;
              do {
                while( true ) {
                  iVar2 = f2n[(ulong)(uint)(iVar1 * iVar10) + lVar11];
                  nodes[lVar11] = iVar2 + -1;
                  if (!bVar13) break;
                  lVar11 = lVar11 + 1;
                  bVar13 = true;
                  if (lVar11 == lVar8) {
                    nodes[lVar8] = *face_index;
                    goto LAB_0010e11a;
                  }
                }
                iVar3 = pRVar5->mpi->id;
                iVar2 = pRVar4->part[(long)iVar2 + -1];
                bVar13 = iVar3 == iVar2;
                lVar11 = lVar11 + 1;
              } while (lVar11 != lVar8);
              nodes[lVar8] = *face_index;
              if (iVar3 == iVar2) {
LAB_0010e11a:
                uVar6 = ref_cell_add(local_40,nodes,&local_34);
                if (uVar6 != 0) {
                  pcVar12 = "add face";
                  uVar9 = 0x71;
                  goto LAB_0010e04a;
                }
                iVar7 = *nface;
              }
            }
            iVar10 = iVar10 + 1;
          } while (iVar10 < iVar7);
        }
        free(nodes);
        uVar6 = 0;
      }
    }
  }
  else {
    pcVar12 = "get face";
    uVar9 = 99;
LAB_0010e04a:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fortran.c",uVar9
           ,"ref_fortran_import_face_",(ulong)uVar6,pcVar12);
  }
  return uVar6;
}

Assistant:

REF_STATUS REF_FORT_(ref_fortran_import_face,
                     REF_FORTRAN_IMPORT_FACE)(REF_INT *face_index,
                                              REF_INT *node_per_face,
                                              REF_INT *nface, REF_INT *f2n) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT *nodes;
  REF_CELL ref_cell;
  REF_INT face, node, new_face;
  REF_BOOL has_a_local_node;

  RSS(ref_grid_face_with(ref_grid, *node_per_face, &ref_cell), "get face");

  ref_malloc(nodes, (*node_per_face) + 1, REF_INT);
  RNS(nodes, "malloc nodes NULL");
  for (face = 0; face < (*nface); face++) {
    has_a_local_node = REF_FALSE;
    for (node = 0; node < (*node_per_face); node++) {
      nodes[node] = f2n[node + (*node_per_face) * face] - 1;
      has_a_local_node =
          has_a_local_node || (ref_mpi_rank(ref_grid_mpi(ref_grid)) ==
                               ref_node_part(ref_node, nodes[node]));
    }
    nodes[(*node_per_face)] = (*face_index);
    if (has_a_local_node)
      RSS(ref_cell_add(ref_cell, nodes, &new_face), "add face");
  }
  free(nodes);
  return REF_SUCCESS;
}